

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::page
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false> *this,int start,
          int end,uint8_t *read,uint8_t *write)

{
  long lVar1;
  int position;
  
  for (lVar1 = (long)start; lVar1 < end; lVar1 = lVar1 + 1) {
    this->read_pages_[lVar1] = read;
    if (read != (uint8_t *)0x0) {
      read = read + 0x100;
    }
    this->write_pages_[lVar1] = write;
    if (write != (uint8_t *)0x0) {
      write = write + 0x100;
    }
  }
  return;
}

Assistant:

void page(int start, int end, uint8_t *read, uint8_t *write) {
			for(int position = start; position < end; ++position) {
				read_pages_[position] = read;
				if(read) read += 256;

				write_pages_[position] = write;
				if(write) write += 256;
			}
		}